

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool test10(void)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  int c;
  queue<int> b;
  queue<int> a;
  int local_64;
  queue<int> local_60;
  queue<int> local_40;
  
  srand(0);
  local_40.mData = (int *)operator_new__(4);
  *local_40.mData = 0;
  local_40.mCap = 1;
  local_40.mSize = 0;
  local_40.mFront = 0;
  local_60.mData = (int *)operator_new__(4);
  *local_60.mData = 0;
  local_60.mCap = 1;
  local_60.mSize = 0;
  local_60.mFront = 0;
  iVar3 = 200;
  do {
    local_64 = rand();
    CP::queue<int>::push(&local_40,&local_64);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  iVar3 = 10;
  do {
    local_64 = rand();
    CP::queue<int>::push(&local_60,&local_64);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  iVar3 = 9000;
  do {
    local_64 = rand();
    CP::queue<int>::push(&local_40,&local_64);
    CP::queue<int>::push(&local_60,&local_64);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  iVar3 = 200;
  do {
    CP::queue<int>::pop(&local_40);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  iVar3 = 10;
  do {
    CP::queue<int>::pop(&local_60);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  if (local_40.mSize == local_60.mSize) {
    bVar4 = local_40.mSize == 0;
    if (!bVar4) {
      bVar4 = false;
      if (local_40.mData[local_40.mFront % local_40.mCap] ==
          local_60.mData[local_60.mFront % local_60.mCap]) {
        uVar1 = 1;
        do {
          uVar2 = uVar1;
          if (local_40.mSize == uVar2) break;
          uVar1 = uVar2 + 1;
        } while (local_40.mData[(local_40.mFront + uVar2) % local_40.mCap] ==
                 local_60.mData[(local_60.mFront + uVar2) % local_60.mCap]);
        bVar4 = local_40.mSize <= uVar2;
      }
    }
    if (!(bool)(bVar4 ^ 1U | local_40.mSize != local_60.mSize)) {
      bVar4 = local_60.mSize == 0;
      if (!bVar4) {
        bVar4 = false;
        if (local_60.mData[local_60.mFront % local_60.mCap] ==
            local_40.mData[local_40.mFront % local_40.mCap]) {
          uVar1 = 1;
          do {
            uVar2 = uVar1;
            if (local_60.mSize == uVar2) break;
            uVar1 = uVar2 + 1;
          } while (local_60.mData[(local_60.mFront + uVar2) % local_60.mCap] ==
                   local_40.mData[(local_40.mFront + uVar2) % local_40.mCap]);
          bVar4 = local_60.mSize <= uVar2;
        }
      }
      goto LAB_001041a5;
    }
  }
  bVar4 = false;
LAB_001041a5:
  if (local_60.mData != (int *)0x0) {
    operator_delete__(local_60.mData);
  }
  if (local_40.mData != (int *)0x0) {
    operator_delete__(local_40.mData);
  }
  return bVar4;
}

Assistant:

bool test10() {
  srand(0);
  CP::queue<int> a,b;
  int f1 = 200;
  int f2 = 10;
  int same = 9000;
  for (int i = 0;i < f1;i++) a.push(rand());
  for (int i = 0;i < f2;i++) b.push(rand());
  for (int i = 0;i < same;i++) {
    int c = rand();
    a.push(c);
    b.push(c);
  }
  for (int i = 0;i < f1;i++) a.pop();
  for (int i = 0;i < f2;i++) b.pop();
  return ( ((a == b))  && ((b == a)));
}